

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v6::internal::fallback_format<long_double>(longdouble d,buffer<char> *buf,int *exp10)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  bigint denominator;
  bigint lower;
  bigint numerator;
  bigint upper_store;
  
  numerator.bigits_.super_buffer<unsigned_int>.size_ = 0;
  numerator.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0013b2a8;
  numerator.bigits_.super_buffer<unsigned_int>.ptr_ = numerator.bigits_.store_;
  numerator.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  numerator.exp_ = 0;
  denominator.bigits_.super_buffer<unsigned_int>.size_ = 0;
  denominator.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0013b2a8;
  denominator.bigits_.super_buffer<unsigned_int>.ptr_ = denominator.bigits_.store_;
  denominator.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  denominator.exp_ = 0;
  lower.bigits_.super_buffer<unsigned_int>.size_ = 0;
  lower.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0013b2a8;
  lower.bigits_.super_buffer<unsigned_int>.ptr_ = lower.bigits_.store_;
  lower.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  lower.exp_ = 0;
  upper_store.bigits_.super_buffer<unsigned_int>.size_ = 0;
  upper_store.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0013b2a8;
  upper_store.bigits_.super_buffer<unsigned_int>.ptr_ = upper_store.bigits_.store_;
  upper_store.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  upper_store.exp_ = 0;
  bigint::assign(&numerator,0);
  bigint::operator<<=(&numerator,0);
  bigint::assign(&lower,1);
  bigint::operator<<=(&lower,0);
  bigint::assign_pow10(&denominator,*exp10);
  bigint::operator<<=(&denominator,1);
  pcVar1 = buf->ptr_;
  lVar6 = 0;
  while( true ) {
    uVar3 = bigint::divmod_assign(&numerator,&denominator);
    iVar4 = compare(&numerator,&lower);
    iVar5 = add_compare(&numerator,&lower,&denominator);
    pcVar1[lVar6] = (char)uVar3 + '0';
    if ((iVar4 < 1) || (-1 < iVar5)) break;
    bigint::multiply(&numerator,10);
    lVar6 = lVar6 + 1;
    bigint::multiply(&lower,10);
  }
  if (iVar4 < 1) {
    if (iVar5 < 0) goto LAB_0011c8c7;
    iVar4 = add_compare(&numerator,&numerator,&denominator);
    if ((iVar4 < 1) && ((uVar3 & 1) == 0 || iVar4 != 0)) goto LAB_0011c8c7;
    cVar2 = pcVar1[lVar6] + '\x01';
  }
  else {
    cVar2 = (char)uVar3 + '1';
  }
  pcVar1[lVar6] = cVar2;
LAB_0011c8c7:
  buffer<char>::resize(buf,lVar6 + 1U & 0xffffffff);
  *exp10 = *exp10 - (int)lVar6;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::~basic_memory_buffer
            (&upper_store.bigits_);
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::~basic_memory_buffer
            (&lower.bigits_);
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::~basic_memory_buffer
            (&denominator.bigits_);
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::~basic_memory_buffer
            (&numerator.bigits_);
  return;
}

Assistant:

void fallback_format(Double d, buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  // TODO: handle float
  int shift = value.assign(d) ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= 1;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  if (!upper) upper = &lower;
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  bool even = (value.f & 1) == 0;
  int num_digits = 0;
  char* data = buf.data();
  for (;;) {
    int digit = numerator.divmod_assign(denominator);
    bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
    // numerator + upper >[=] pow10:
    bool high = add_compare(numerator, *upper, denominator) + even > 0;
    data[num_digits++] = static_cast<char>('0' + digit);
    if (low || high) {
      if (!low) {
        ++data[num_digits - 1];
      } else if (high) {
        int result = add_compare(numerator, numerator, denominator);
        // Round half to even.
        if (result > 0 || (result == 0 && (digit % 2) != 0))
          ++data[num_digits - 1];
      }
      buf.resize(num_digits);
      exp10 -= num_digits - 1;
      return;
    }
    numerator *= 10;
    lower *= 10;
    if (upper != &lower) *upper *= 10;
  }
}